

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QBitArray *array)

{
  Data *pDVar1;
  char *pcVar2;
  storage_type *in_RCX;
  long lVar3;
  long in_RDX;
  char *pcVar4;
  QTextStream *pQVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)array);
  pQVar5 = (QTextStream *)(array->d).d.d;
  *(undefined1 *)&pQVar5[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QBitArray(";
  QString::fromUtf8(&local_48,(QString *)0xa,ba);
  QTextStream::operator<<(pQVar5,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = (QTextStream *)(array->d).d.d;
  if (*(char *)&pQVar5[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar5,' ');
  }
  pcVar2 = *(char **)(in_RDX + 8);
  lVar3 = *(long *)(in_RDX + 0x10) * 8;
  pcVar4 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = "";
  }
  if (lVar3 != *pcVar4 && -1 < lVar3 - *pcVar4) {
    uVar6 = 0;
    do {
      pQVar5 = (QTextStream *)(array->d).d.d;
      if (((byte)pcVar2[(uVar6 >> 3) + 1] >> ((uint)uVar6 & 7) & 1) == 0) {
        QTextStream::operator<<(pQVar5,'0');
        pQVar5 = (QTextStream *)(array->d).d.d;
        if (*(char *)&(((QArrayData *)&pQVar5[3]._vptr_QTextStream)->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') goto LAB_0035c374;
      }
      else {
        QTextStream::operator<<(pQVar5,'1');
        pQVar5 = (QTextStream *)(array->d).d.d;
        if (*(char *)&(((QArrayData *)&pQVar5[3]._vptr_QTextStream)->ref_)._q_value.
                      super___atomic_base<int>._M_i != '\0') {
LAB_0035c374:
          QTextStream::operator<<(pQVar5,' ');
        }
      }
      uVar6 = uVar6 + 1;
      if ((uVar6 & 3) == 0) {
        pcVar2 = *(char **)(in_RDX + 8);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "";
        }
        if ((long)uVar6 < *(long *)(in_RDX + 0x10) * 8 - (long)*pcVar2) {
          QTextStream::operator<<((QTextStream *)(array->d).d.d,' ');
          pQVar5 = (QTextStream *)(array->d).d.d;
          if (*(char *)&pQVar5[3]._vptr_QTextStream == '\x01') {
            QTextStream::operator<<(pQVar5,' ');
          }
        }
      }
      pcVar2 = *(char **)(in_RDX + 8);
      pcVar4 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pcVar4 = "";
      }
    } while ((long)uVar6 < *(long *)(in_RDX + 0x10) * 8 - (long)*pcVar4);
  }
  QTextStream::operator<<((QTextStream *)(array->d).d.d,')');
  pQVar5 = (QTextStream *)(array->d).d.d;
  if (*(char *)&pQVar5[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar5,' ');
  }
  pDVar1 = (array->d).d.d;
  (array->d).d.d = (Data *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pDVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QBitArray &array)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QBitArray(";
    for (qsizetype i = 0; i < array.size();) {
        if (array.testBit(i))
            dbg << '1';
        else
            dbg << '0';
        i += 1;
        if (!(i % 4) && (i < array.size()))
            dbg << ' ';
    }
    dbg << ')';
    return dbg;
}